

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  stbi_uc *psVar14;
  stbi_uc sVar15;
  byte *pbVar16;
  byte *pbVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  stbi__uint32 sVar21;
  stbi__uint32 sVar22;
  uint uVar23;
  char *pcVar24;
  int iVar25;
  ulong uVar26;
  char *pcVar27;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0012586f:
    a->num_bits = 0;
    a->hit_zeof_once = 0;
    a->code_buffer = 0;
    z = &a->z_distance;
    iVar13 = 0;
    do {
      if (iVar13 < 1) {
        stbi__fill_bits(a);
        iVar13 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar21 = uVar1 >> 1;
      a->code_buffer = sVar21;
      iVar7 = iVar13 + -1;
      a->num_bits = iVar7;
      if (iVar13 < 3) {
        stbi__fill_bits(a);
        iVar7 = a->num_bits;
        sVar21 = a->code_buffer;
      }
      sVar22 = sVar21 >> 2;
      a->code_buffer = sVar22;
      uVar6 = iVar7 - 2;
      a->num_bits = uVar6;
      switch(sVar21 & 3) {
      case 0:
        uVar10 = uVar6 & 7;
        if (uVar10 != 0) {
          if (iVar7 < 2) {
            stbi__fill_bits(a);
            uVar6 = a->num_bits;
            sVar22 = a->code_buffer;
          }
          sVar22 = sVar22 >> (sbyte)uVar10;
          a->code_buffer = sVar22;
          uVar6 = uVar6 - uVar10;
          a->num_bits = uVar6;
        }
        if (0 < (int)uVar6) {
          uVar10 = uVar6 - 1 >> 3;
          uVar26 = (ulong)(uVar10 + 1);
          uVar18 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar18 + 1) = (char)sVar22;
            sVar22 = sVar22 >> 8;
            uVar18 = uVar18 + 1;
          } while (uVar10 != uVar18);
          iVar13 = uVar6 - (uVar6 - 1 & 0xfffffff8);
          a->code_buffer = sVar22;
          a->num_bits = iVar13 + -8;
          if (iVar13 == 8) {
            if (uVar18 < 3) goto LAB_001260f6;
            goto LAB_00126124;
          }
LAB_00126229:
          pcVar24 = "zlib corrupt";
LAB_00126240:
          puVar9 = (undefined8 *)__tls_get_addr(&PTR_00162d50);
          *puVar9 = pcVar24;
          return 0;
        }
        if ((int)uVar6 < 0) goto LAB_00126229;
        uVar26 = 0;
LAB_001260f6:
        psVar14 = a->zbuffer;
        psVar3 = a->zbuffer_end;
        do {
          if (psVar14 < psVar3) {
            a->zbuffer = psVar14 + 1;
            sVar15 = *psVar14;
            psVar14 = psVar14 + 1;
          }
          else {
            sVar15 = '\0';
          }
          *(stbi_uc *)((long)local_814.fast + uVar26) = sVar15;
          uVar26 = uVar26 + 1;
        } while (uVar26 != 4);
LAB_00126124:
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_00126229;
        psVar14 = a->zbuffer;
        uVar26 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar14 + uVar26) {
          pcVar24 = "read past buffer";
          goto LAB_00126240;
        }
        pcVar24 = a->zout;
        if (a->zout_end < pcVar24 + uVar26) {
          iVar13 = stbi__zexpand(a,pcVar24,(uint)local_814.fast[0]);
          if (iVar13 == 0) {
            return 0;
          }
          psVar14 = a->zbuffer;
          pcVar24 = a->zout;
        }
        memcpy(pcVar24,psVar14,uVar26);
        a->zbuffer = a->zbuffer + uVar26;
        a->zout = a->zout + uVar26;
        goto LAB_0012618f;
      case 1:
        iVar13 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar13 == 0) {
          return 0;
        }
        iVar13 = stbi__zbuild_huffman
                           (z,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar7 < 7) {
          stbi__fill_bits(a);
          uVar6 = a->num_bits;
          sVar22 = a->code_buffer;
        }
        sVar21 = sVar22 >> 5;
        a->code_buffer = sVar21;
        iVar13 = uVar6 - 5;
        a->num_bits = iVar13;
        if ((int)uVar6 < 10) {
          stbi__fill_bits(a);
          iVar13 = a->num_bits;
          sVar21 = a->code_buffer;
        }
        uVar6 = sVar21 >> 5;
        a->code_buffer = uVar6;
        iVar7 = iVar13 + -5;
        a->num_bits = iVar7;
        if (iVar13 < 9) {
          stbi__fill_bits(a);
          iVar7 = a->num_bits;
          uVar6 = a->code_buffer;
        }
        uVar23 = (sVar22 & 0x1f) + 0x101;
        iVar13 = (sVar21 & 0x1f) + 1;
        uVar10 = uVar6 >> 4;
        a->code_buffer = uVar10;
        iVar7 = iVar7 + -4;
        a->num_bits = iVar7;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar26 = 0;
        do {
          uVar11 = uVar10;
          if (iVar7 < 3) {
            stbi__fill_bits(a);
            iVar7 = a->num_bits;
            uVar11 = a->code_buffer;
          }
          uVar10 = uVar11 >> 3;
          a->code_buffer = uVar10;
          iVar7 = iVar7 + -3;
          a->num_bits = iVar7;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar26]
                   ) = (byte)uVar11 & 7;
          uVar26 = uVar26 + 1;
        } while ((uVar6 & 0xf) + 4 != uVar26);
        iVar7 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar7 == 0) {
          return 0;
        }
        iVar8 = iVar13 + uVar23;
        iVar7 = a->num_bits;
        iVar25 = 0;
        do {
          if (iVar7 < 0x10) {
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
            }
            else {
              if (a->hit_zeof_once != 0) goto LAB_001261ba;
              a->hit_zeof_once = 1;
              a->num_bits = iVar7 + 0x10;
            }
          }
          uVar6 = a->code_buffer;
          uVar5 = local_814.fast[uVar6 & 0x1ff];
          if (uVar5 == 0) {
            uVar5 = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
            uVar10 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
            uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
            uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
            lVar12 = 0;
            do {
              lVar19 = lVar12;
              lVar12 = lVar19 + 1;
            } while (local_814.maxcode[lVar19 + 10] <= (int)uVar10);
            if (((0xf < lVar19 + 10U) ||
                (lVar20 = (ulong)local_814.firstsymbol[lVar19 + 10] +
                          ((ulong)(uVar10 >> (7U - (char)lVar12 & 0x1f)) -
                          (ulong)local_814.firstcode[lVar19 + 10]), 0x11f < (int)lVar20)) ||
               ((ulong)*(byte *)((long)&local_814 + lVar20 + 0x484) - 9 != lVar12))
            goto LAB_001261ba;
            uVar6 = uVar6 >> ((byte)(lVar19 + 10U) & 0x1f);
            a->code_buffer = uVar6;
            iVar7 = (a->num_bits - (int)lVar12) + -9;
            a->num_bits = iVar7;
            uVar5 = *(ushort *)((long)&local_814 + lVar20 * 2 + 0x5a4);
          }
          else {
            uVar6 = uVar6 >> ((byte)(uVar5 >> 9) & 0x1f);
            a->code_buffer = uVar6;
            iVar7 = a->num_bits - (uint)(uVar5 >> 9);
            a->num_bits = iVar7;
            uVar5 = uVar5 & 0x1ff;
          }
          if (0x12 < uVar5) goto LAB_001261ba;
          if (uVar5 < 0x10) {
            lVar12 = (long)iVar25;
            iVar25 = iVar25 + 1;
            local_9e8[lVar12] = (char)uVar5;
          }
          else {
            if (uVar5 == 0x11) {
              if (iVar7 < 3) {
                stbi__fill_bits(a);
                iVar7 = a->num_bits;
                uVar6 = a->code_buffer;
              }
              a->code_buffer = uVar6 >> 3;
              iVar7 = iVar7 + -3;
              a->num_bits = iVar7;
              uVar6 = (uVar6 & 7) + 3;
LAB_00126066:
              bVar4 = 0;
            }
            else {
              if (uVar5 != 0x10) {
                if (iVar7 < 7) {
                  stbi__fill_bits(a);
                  iVar7 = a->num_bits;
                  uVar6 = a->code_buffer;
                }
                a->code_buffer = uVar6 >> 7;
                iVar7 = iVar7 + -7;
                a->num_bits = iVar7;
                uVar6 = (uVar6 & 0x7f) + 0xb;
                goto LAB_00126066;
              }
              if (iVar7 < 2) {
                stbi__fill_bits(a);
                iVar7 = a->num_bits;
                uVar6 = a->code_buffer;
              }
              a->code_buffer = uVar6 >> 2;
              iVar7 = iVar7 + -2;
              a->num_bits = iVar7;
              if (iVar25 == 0) goto LAB_001261ba;
              uVar6 = (uVar6 & 3) + 3;
              bVar4 = (&bStack_9e9)[iVar25];
            }
            if (iVar8 - iVar25 < (int)uVar6) goto LAB_001261ba;
            memset(local_9e8 + iVar25,(uint)bVar4,(ulong)uVar6);
            iVar25 = iVar25 + uVar6;
          }
        } while (iVar25 < iVar8);
        if (iVar25 != iVar8) {
LAB_001261ba:
          puVar9 = (undefined8 *)__tls_get_addr(&PTR_00162d50);
          *puVar9 = "bad codelengths";
          return 0;
        }
        iVar7 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar23);
        if (iVar7 == 0) {
          return 0;
        }
        iVar13 = stbi__zbuild_huffman(z,local_9e8 + uVar23,iVar13);
        break;
      case 3:
        goto LAB_00126217;
      }
      if (iVar13 == 0) {
        return 0;
      }
      pcVar27 = "bad huffman code";
      pcVar24 = a->zout;
      while( true ) {
        while( true ) {
          if (a->num_bits < 0x10) {
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
            }
            else {
              if (a->hit_zeof_once != 0) goto LAB_00126202;
              a->hit_zeof_once = 1;
              a->num_bits = a->num_bits + 0x10;
            }
          }
          uVar6 = a->code_buffer;
          uVar5 = (a->z_length).fast[uVar6 & 0x1ff];
          if (uVar5 == 0) {
            uVar5 = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
            uVar10 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
            uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
            uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
            lVar12 = 0;
            do {
              lVar19 = lVar12;
              lVar12 = lVar19 + 1;
            } while ((a->z_length).maxcode[lVar19 + 10] <= (int)uVar10);
            if (((0xf < lVar19 + 10U) ||
                (lVar20 = (ulong)(a->z_length).firstsymbol[lVar19 + 10] +
                          ((ulong)(uVar10 >> (7U - (char)lVar12 & 0x1f)) -
                          (ulong)(a->z_length).firstcode[lVar19 + 10]), 0x11f < (int)lVar20)) ||
               ((ulong)*(byte *)((long)a + lVar20 + 0x4c0) - 9 != lVar12)) goto LAB_00126202;
            uVar6 = uVar6 >> ((byte)(lVar19 + 10U) & 0x1f);
            a->code_buffer = uVar6;
            iVar13 = (a->num_bits - (int)lVar12) + -9;
            a->num_bits = iVar13;
            uVar10 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0x5e0);
          }
          else {
            uVar6 = uVar6 >> ((byte)(uVar5 >> 9) & 0x1f);
            a->code_buffer = uVar6;
            iVar13 = a->num_bits - (uint)(uVar5 >> 9);
            a->num_bits = iVar13;
            uVar10 = uVar5 & 0x1ff;
          }
          if (0xff < uVar10) break;
          if (a->zout_end <= pcVar24) {
            iVar13 = stbi__zexpand(a,pcVar24,1);
            if (iVar13 == 0) {
              return 0;
            }
            pcVar24 = a->zout;
          }
          *pcVar24 = (char)uVar10;
          pcVar24 = pcVar24 + 1;
        }
        if (uVar10 == 0x100) break;
        if (0x11d < uVar10) goto LAB_00126202;
        uVar26 = (ulong)(uVar10 - 0x101);
        uVar10 = stbi__zlength_base[uVar26];
        if (0xffffffffffffffeb < uVar26 - 0x1c) {
          iVar7 = stbi__zlength_extra[uVar26];
          if (iVar13 < iVar7) {
            stbi__fill_bits(a);
            iVar13 = a->num_bits;
            uVar6 = a->code_buffer;
          }
          uVar23 = ~(-1 << ((byte)iVar7 & 0x1f)) & uVar6;
          uVar6 = uVar6 >> ((byte)iVar7 & 0x1f);
          a->code_buffer = uVar6;
          iVar13 = iVar13 - iVar7;
          a->num_bits = iVar13;
          uVar10 = uVar10 + uVar23;
        }
        if (iVar13 < 0x10) {
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            uVar6 = a->code_buffer;
          }
          else {
            if (a->hit_zeof_once != 0) goto LAB_00126202;
            a->hit_zeof_once = 1;
            a->num_bits = iVar13 + 0x10;
          }
        }
        uVar5 = z->fast[uVar6 & 0x1ff];
        if (uVar5 == 0) {
          uVar5 = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
          uVar23 = (uVar5 & 0xf0f) << 4 | (uVar5 & 0xf0f0) >> 4;
          uVar23 = (uVar23 >> 2 & 0x3333) + (uVar23 & 0x3333) * 4;
          uVar23 = (uVar23 >> 1 & 0x5555) + (uVar23 & 0x5555) * 2;
          lVar12 = 0;
          do {
            lVar19 = lVar12;
            lVar12 = lVar19 + 1;
          } while ((a->z_distance).maxcode[lVar19 + 10] <= (int)uVar23);
          if (((0xf < lVar19 + 10U) ||
              (lVar20 = (ulong)(a->z_distance).firstsymbol[lVar19 + 10] +
                        ((ulong)(uVar23 >> (7U - (char)lVar12 & 0x1f)) -
                        (ulong)(a->z_distance).firstcode[lVar19 + 10]), 0x11f < (int)lVar20)) ||
             ((ulong)*(byte *)((long)a + lVar20 + 0xca4) - 9 != lVar12)) goto LAB_00126202;
          uVar6 = uVar6 >> ((byte)(lVar19 + 10U) & 0x1f);
          a->code_buffer = uVar6;
          iVar13 = (a->num_bits - (int)lVar12) + -9;
          a->num_bits = iVar13;
          uVar23 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0xdc4);
        }
        else {
          uVar6 = uVar6 >> ((byte)(uVar5 >> 9) & 0x1f);
          a->code_buffer = uVar6;
          iVar13 = a->num_bits - (uint)(uVar5 >> 9);
          a->num_bits = iVar13;
          uVar23 = uVar5 & 0x1ff;
        }
        if (0x1d < uVar23) goto LAB_00126202;
        iVar7 = stbi__zdist_base[uVar23];
        if (3 < uVar23) {
          iVar8 = stbi__zdist_extra[uVar23];
          if (iVar13 < iVar8) {
            stbi__fill_bits(a);
            iVar13 = a->num_bits;
            uVar6 = a->code_buffer;
          }
          a->code_buffer = uVar6 >> ((byte)iVar8 & 0x1f);
          a->num_bits = iVar13 - iVar8;
          iVar7 = iVar7 + (~(-1 << ((byte)iVar8 & 0x1f)) & uVar6);
        }
        if ((long)pcVar24 - (long)a->zout_start < (long)iVar7) {
          pcVar27 = "bad dist";
          goto LAB_00126202;
        }
        if ((long)a->zout_end - (long)pcVar24 < (long)(int)uVar10) {
          iVar13 = stbi__zexpand(a,pcVar24,uVar10);
          if (iVar13 == 0) {
            return 0;
          }
          pcVar24 = a->zout;
        }
        lVar12 = -(long)iVar7;
        if (iVar7 == 1) {
          if (uVar10 != 0) {
            memset(pcVar24,(uint)(byte)pcVar24[lVar12],(ulong)uVar10);
            pcVar24 = pcVar24 + (ulong)(uVar10 - 1) + 1;
          }
        }
        else {
          for (; uVar10 != 0; uVar10 = uVar10 - 1) {
            *pcVar24 = pcVar24[lVar12];
            pcVar24 = pcVar24 + 1;
          }
        }
      }
      a->zout = pcVar24;
      if ((a->hit_zeof_once != 0) && (iVar13 < 0x10)) {
        pcVar27 = "unexpected end";
LAB_00126202:
        puVar9 = (undefined8 *)__tls_get_addr(&PTR_00162d50);
        *puVar9 = pcVar27;
        return 0;
      }
LAB_0012618f:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar13 = a->num_bits;
    } while( true );
  }
  pbVar16 = a->zbuffer;
  pbVar2 = a->zbuffer_end;
  uVar5 = 0;
  if (pbVar16 < pbVar2) {
    a->zbuffer = pbVar16 + 1;
    bVar4 = *pbVar16;
    pbVar16 = pbVar16 + 1;
  }
  else {
    bVar4 = 0;
  }
  pbVar17 = pbVar16;
  if (pbVar16 < pbVar2) {
    pbVar17 = pbVar16 + 1;
    a->zbuffer = pbVar17;
    uVar5 = (ushort)*pbVar16;
  }
  pcVar24 = "bad zlib header";
  if ((pbVar17 < pbVar2) && ((ushort)(((ushort)bVar4 << 8 | uVar5) * 0x7bdf) < 0x843)) {
    if ((uVar5 & 0x20) == 0) {
      if ((bVar4 & 0xf) == 8) goto LAB_0012586f;
      pcVar24 = "bad compression";
    }
    else {
      pcVar24 = "no preset dict";
    }
  }
  puVar9 = (undefined8 *)__tls_get_addr(&PTR_00162d50);
  *puVar9 = pcVar24;
LAB_00126217:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}